

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O3

void __thiscall helics::apps::BrokerServer::forceTerminate(BrokerServer *this)

{
  char cVar1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range2;
  shared_ptr<helics::Broker> *brk;
  long *plVar2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  brokerList;
  long *local_28;
  long *local_20;
  
  closeServers(this);
  BrokerFactory::getAllBrokers();
  for (plVar2 = local_28; plVar2 != local_20; plVar2 = plVar2 + 2) {
    if ((long *)*plVar2 != (long *)0x0) {
      cVar1 = (**(code **)(*(long *)*plVar2 + 0x20))();
      if (cVar1 != '\0') {
        (**(code **)(*(long *)*plVar2 + 0x18))();
      }
    }
  }
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
           *)&local_28);
  return;
}

Assistant:

void BrokerServer::forceTerminate()
{
    closeServers();
    auto brokerList = BrokerFactory::getAllBrokers();
    for (auto& brk : brokerList) {
        if (!brk) {
            continue;
        }
        if (brk->isConnected()) {
            brk->disconnect();
        }
    }
}